

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::DoVerticalBar(ParseState *this)

{
  uint8 uVar1;
  uint8 uVar2;
  Regexp *pRVar3;
  Regexp *pRVar4;
  Regexp *this_00;
  
  MaybeConcatString(this,-1,NoParseFlags);
  DoConcatenation(this);
  this_00 = this->stacktop_;
  if (((this_00 == (Regexp *)0x0) || (pRVar3 = this_00->down_, pRVar3 == (Regexp *)0x0)) ||
     (pRVar3->op_ != '\x17')) {
    PushSimpleOp(this,kRegexpCharClass|kRegexpLiteral);
    return true;
  }
  pRVar4 = pRVar3->down_;
  if (pRVar4 == (Regexp *)0x0) {
LAB_0012ce7c:
    this_00->down_ = pRVar4;
    pRVar3->down_ = this_00;
    this->stacktop_ = pRVar3;
  }
  else {
    uVar1 = this_00->op_;
    uVar2 = pRVar4->op_;
    if (uVar1 == '\f') {
      if (uVar2 != '\x03') {
        if (uVar2 == '\f') goto LAB_0012ce71;
        if (uVar2 != '\x14') goto LAB_0012ce7c;
      }
      this_00->down_ = pRVar4->down_;
      pRVar3->down_ = this_00;
      this->stacktop_ = pRVar3;
      this_00 = pRVar4;
    }
    else {
      if ((uVar2 != '\f') || ((uVar1 != '\x14' && (uVar1 != '\x03')))) goto LAB_0012ce7c;
LAB_0012ce71:
      this->stacktop_ = pRVar3;
    }
    Decref(this_00);
  }
  return true;
}

Assistant:

bool Regexp::ParseState::DoVerticalBar() {
  MaybeConcatString(-1, NoParseFlags);
  DoConcatenation();

  // Below the vertical bar is a list to alternate.
  // Above the vertical bar is a list to concatenate.
  // We just did the concatenation, so either swap
  // the result below the vertical bar or push a new
  // vertical bar on the stack.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) != NULL &&
      (r2 = r1->down_) != NULL &&
      r2->op() == kVerticalBar) {
    Regexp* r3;
    if ((r3 = r2->down_) != NULL &&
        (r1->op() == kRegexpAnyChar || r3->op() == kRegexpAnyChar)) {
      // AnyChar is above or below the vertical bar. Let it subsume
      // the other when the other is Literal, CharClass or AnyChar.
      if (r3->op() == kRegexpAnyChar &&
          (r1->op() == kRegexpLiteral ||
           r1->op() == kRegexpCharClass ||
           r1->op() == kRegexpAnyChar)) {
        // Discard r1.
        stacktop_ = r2;
        r1->Decref();
        return true;
      }
      if (r1->op() == kRegexpAnyChar &&
          (r3->op() == kRegexpLiteral ||
           r3->op() == kRegexpCharClass ||
           r3->op() == kRegexpAnyChar)) {
        // Rearrange the stack and discard r3.
        r1->down_ = r3->down_;
        r2->down_ = r1;
        stacktop_ = r2;
        r3->Decref();
        return true;
      }
    }
    // Swap r1 below vertical bar (r2).
    r1->down_ = r2->down_;
    r2->down_ = r1;
    stacktop_ = r2;
    return true;
  }
  return PushSimpleOp(kVerticalBar);
}